

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::PausableReadAsyncIoStream::write
          (PausableReadAsyncIoStream *this,int __fd,void *__buf,size_t __n)

{
  AsyncIoStream *pAVar1;
  undefined4 in_register_00000034;
  PausableReadAsyncIoStream *this_00;
  Deferred<kj::Function<void_()>_> local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 local_30 [16];
  PausableReadAsyncIoStream *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  this_00 = (PausableReadAsyncIoStream *)CONCAT44(in_register_00000034,__fd);
  local_30._8_8_ = this_00;
  this_local = (PausableReadAsyncIoStream *)__buf;
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__n;
  pieces_local.size_ = (size_t)this;
  pAVar1 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->(&this_00->inner);
  local_48 = this_local._0_4_;
  uStack_44 = this_local._4_4_;
  uStack_40 = pieces_local.ptr._0_4_;
  uStack_3c = pieces_local.ptr._4_4_;
  (*(pAVar1->super_AsyncOutputStream)._vptr_AsyncOutputStream[1])
            (local_30,&pAVar1->super_AsyncOutputStream,this_local,pieces_local.ptr);
  trackWrite(&local_60,this_00);
  Promise<void>::attach<kj::_::Deferred<kj::Function<void()>>>
            ((Promise<void> *)this,(Deferred<kj::Function<void_()>_> *)local_30);
  kj::_::Deferred<kj::Function<void_()>_>::~Deferred(&local_60);
  Promise<void>::~Promise((Promise<void> *)local_30);
  return (ssize_t)this;
}

Assistant:

kj::Promise<void> PausableReadAsyncIoStream::write(
    kj::ArrayPtr<const kj::ArrayPtr<const byte>> pieces) {
  return inner->write(pieces).attach(trackWrite());
}